

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_io.c
# Opt level: O0

light_pcapng light_read_stream(light_pcapng_stream pcapng)

{
  int iVar1;
  uint32_t *memory;
  light_pcapng p_Var2;
  __fd_t in_RDI;
  uint32_t *block_data;
  uint32_t block_total_length;
  uint32_t block_type;
  size_t in_stack_ffffffffffffffd8;
  size_t count;
  uint32_t uVar3;
  uint32_t uVar4;
  
  uVar4 = 0;
  uVar3 = 0;
  count = 0;
  if ((in_RDI != (__fd_t)0x0) && (*(int *)&in_RDI->_IO_read_end != 0)) {
    if ((uint32_t *)in_RDI->_IO_read_ptr != (uint32_t *)0x0) {
      light_pcapng_release((light_pcapng)in_RDI);
      in_RDI->_IO_read_ptr = (char *)0x0;
    }
    iVar1 = light_read(in_RDI,(void *)CONCAT44(uVar4,uVar3),count);
    if ((iVar1 != -1) &&
       (iVar1 = light_read(in_RDI,(void *)CONCAT44(uVar4,uVar3),count), iVar1 != -1)) {
      memory = (uint32_t *)malloc((ulong)uVar3);
      if (memory == (uint32_t *)0x0) {
        *(undefined4 *)&in_RDI->_IO_read_end = 0;
        return (light_pcapng)0x0;
      }
      *memory = uVar4;
      memory[1] = uVar3;
      iVar1 = light_read(in_RDI,(void *)CONCAT44(uVar4,uVar3),(size_t)memory);
      if (iVar1 != -1) {
        p_Var2 = light_read_from_memory(memory,in_stack_ffffffffffffffd8);
        in_RDI->_IO_read_ptr = (char *)p_Var2;
        free(memory);
        return (light_pcapng)in_RDI->_IO_read_ptr;
      }
      free(memory);
      *(undefined4 *)&in_RDI->_IO_read_end = 0;
      return (light_pcapng)0x0;
    }
    *(undefined4 *)&in_RDI->_IO_read_end = 0;
  }
  return (light_pcapng)0x0;
}

Assistant:

light_pcapng light_read_stream(light_pcapng_stream pcapng)
{
	uint32_t block_type = 0;
	uint32_t block_total_length = 0;
	uint32_t *block_data = NULL;

	if (pcapng == NULL || !pcapng->valid) {
		return NULL;
	}

	if (pcapng->current_block) {
		light_pcapng_release(pcapng->current_block);
		pcapng->current_block = NULL;
	}

	if (light_read(pcapng->stream.fd, &block_type, sizeof(block_type)) == -1 ||
			light_read(pcapng->stream.fd, &block_total_length, sizeof(block_total_length)) == -1) {
		pcapng->valid = 0;
		return NULL;
	}

	block_data = malloc(block_total_length);
	if (block_data == NULL) {
		pcapng->valid = 0;
		return NULL;
	}

	block_data[0] = block_type;
	block_data[1] = block_total_length;

	if (light_read(pcapng->stream.fd, &block_data[2], block_total_length - 2 * sizeof(uint32_t)) == -1) {
		free(block_data);
		pcapng->valid = 0;
		return NULL;
	}

	pcapng->current_block = light_read_from_memory(block_data, block_total_length);
	free(block_data);

	return pcapng->current_block;
}